

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void __thiscall
despot::VNode::VNode(VNode *this,int count,double value,int depth,QNode *parent,OBS_TYPE edge)

{
  (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->belief_ = (Belief *)0x0;
  (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->depth_ = depth;
  this->parent_ = parent;
  this->edge_ = edge;
  (this->children_).super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children_).super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children_).super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ValuedAction::ValuedAction(&this->default_move_);
  this->count_ = count;
  this->value_ = value;
  return;
}

Assistant:

VNode::VNode(int count, double value, int depth, QNode* parent, OBS_TYPE edge) :
	belief_(NULL),
	depth_(depth),
	parent_(parent),
	edge_(edge),
	count_(count),
	value_(value) {
}